

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::PushMultiItemsWidths(int components,float w_full)

{
  ImVector<float> *this;
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  value_type *pvVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  float w_item_last;
  float w_item_one;
  float local_30;
  float local_2c;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->WriteAccessed = true;
  if (w_full <= 0.0) {
    w_full = CalcItemWidth();
  }
  fVar7 = (pIVar2->Style).ItemInnerSpacing.x;
  iVar4 = components + -1;
  fVar8 = (float)(int)((w_full - fVar7 * (float)iVar4) / (float)components);
  local_2c = 1.0;
  if (1.0 <= fVar8) {
    local_2c = fVar8;
  }
  fVar7 = (float)(int)(w_full - (local_2c + fVar7) * (float)iVar4);
  local_30 = 1.0;
  if (1.0 <= fVar7) {
    local_30 = fVar7;
  }
  this = &(pIVar1->DC).ItemWidthStack;
  ImVector<float>::push_back(this,&local_30);
  iVar5 = 0;
  if (0 < iVar4) {
    iVar5 = iVar4;
  }
  while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
    ImVector<float>::push_back(this,&local_2c);
  }
  pvVar3 = ImVector<float>::back(this);
  (pIVar1->DC).ItemWidth = *pvVar3;
  return;
}

Assistant:

void ImGui::PushMultiItemsWidths(int components, float w_full)
{
    ImGuiWindow* window = GetCurrentWindow();
    const ImGuiStyle& style = GImGui->Style;
    if (w_full <= 0.0f)
        w_full = CalcItemWidth();
    const float w_item_one  = ImMax(1.0f, (float)(int)((w_full - (style.ItemInnerSpacing.x) * (components-1)) / (float)components));
    const float w_item_last = ImMax(1.0f, (float)(int)(w_full - (w_item_one + style.ItemInnerSpacing.x) * (components-1)));
    window->DC.ItemWidthStack.push_back(w_item_last);
    for (int i = 0; i < components-1; i++)
        window->DC.ItemWidthStack.push_back(w_item_one);
    window->DC.ItemWidth = window->DC.ItemWidthStack.back();
}